

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf2.c
# Opt level: O2

void gf2Inv(word *b,word *a,qr_o *f,void *stack)

{
  if ((*f->params & 0x3f) != 0) {
    ppInvMod(b,a,f->mod,f->n,stack);
    return;
  }
  ppInvMod((word *)stack,a,f->mod,f->n + 1,(void *)((long)stack + f->n * 8 + 8));
  wwCopy(b,(word *)stack,f->n);
  return;
}

Assistant:

static void gf2Inv(word b[], const word a[], const qr_o* f, void* stack)
{
	ASSERT(gf2IsOperable(f));
	ASSERT(gf2IsIn(a, f));
	if (gf2Deg(f) % B_PER_W == 0)
	{
		word* c = (word*)stack;
		stack = c + f->n + 1;
		ppInvMod(c, a, f->mod, f->n + 1, stack);
		ASSERT(c[f->n] == 0);
		wwCopy(b, c, f->n);
	}
	else
		ppInvMod(b, a, f->mod, f->n, stack);
}